

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::compiler::Version::ByteSizeLong(Version *this)

{
  long lVar1;
  anon_union_32_1_493b367e_for_Version_3 aVar2;
  ulong uVar3;
  size_t sVar4;
  
  aVar2 = this->field_0;
  if (((undefined1  [32])aVar2 & (undefined1  [32])0xf) == (undefined1  [32])0x0) {
    sVar4 = 0;
  }
  else {
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
      sVar4 = 0;
    }
    else {
      sVar4 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.suffix_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar4 = sVar4 + 1;
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      uVar3 = (long)(this->field_0)._impl_.major_ | 1;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
      uVar3 = (long)(this->field_0)._impl_.minor_ | 1;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x8) != (undefined1  [32])0x0) {
      uVar3 = (long)(this->field_0)._impl_.patch_ | 1;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t Version::ByteSizeLong() const {
  const Version& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.Version)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // optional string suffix = 4;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_suffix());
    }
    // optional int32 major = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_major());
    }
    // optional int32 minor = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_minor());
    }
    // optional int32 patch = 3;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_patch());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}